

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr * __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler>::
ReadLogicalExpr_abi_cxx11_(NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *this)

{
  char cVar1;
  TextReader<fmt::Locale> *this_00;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *in_RSI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *in_RDI;
  char c;
  int in_stack_000003c4;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *in_stack_000003c8;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *this_01;
  CStringRef in_stack_ffffffffffffffe0;
  
  this_01 = in_RDI;
  cVar1 = ReaderBase::ReadChar(&in_RSI->reader_->super_ReaderBase);
  this_00 = (TextReader<fmt::Locale> *)(ulong)((int)cVar1 - 0x6c);
  switch(this_00) {
  case (TextReader<fmt::Locale> *)0x0:
  case (TextReader<fmt::Locale> *)0x2:
  case (TextReader<fmt::Locale> *)0x7:
    NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler>::ReadConstant
              (in_RSI,(char)((ulong)this_01 >> 0x38));
    TestNLHandler::OnBool_abi_cxx11_((TestNLHandler *)this_01,SUB81((ulong)in_RDI >> 0x38,0));
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"expected logical expression");
    TextReader<fmt::Locale>::ReportError<>(this_00,in_stack_ffffffffffffffe0);
    std::__cxx11::string::string((string *)in_RDI);
    break;
  case (TextReader<fmt::Locale> *)0x3:
    NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler>::ReadOpCode(in_RDI);
    ReadLogicalExpr_abi_cxx11_(in_stack_000003c8,in_stack_000003c4);
  }
  return (LogicalExpr *)this_01;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}